

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_serializer.cxx
# Opt level: O1

void __thiscall nuraft::buffer_serializer::put_u16(buffer_serializer *this,uint16_t val)

{
  size_t sVar1;
  size_t sVar2;
  byte *pbVar3;
  overflow_error *this_00;
  byte bVar4;
  
  sVar1 = this->pos_;
  sVar2 = buffer::size(this->buf_);
  if (sVar1 + 2 <= sVar2) {
    pbVar3 = buffer::data_begin(this->buf_);
    sVar1 = this->pos_;
    bVar4 = (byte)(val >> 8);
    if (this->endian_ == LITTLE) {
      pbVar3[sVar1] = (byte)val;
      pbVar3[sVar1 + 1] = bVar4;
    }
    else {
      pbVar3[sVar1 + 1] = (byte)val;
      pbVar3[sVar1] = bVar4;
    }
    pos(this,this->pos_ + 2);
    return;
  }
  this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
  std::overflow_error::overflow_error(this_00,"not enough space");
  __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
}

Assistant:

void buffer_serializer::put_u16(uint16_t val) {
    chk_length(val);
    uint8_t* ptr = buf_.data_begin() + pos_;
    if (endian_ == LITTLE)  { put16l(val, ptr); }
    else                    { put16b(val, ptr); }
    pos( pos() + sizeof(val) );
}